

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O3

QTransform * __thiscall
QTransform::inverted(QTransform *__return_storage_ptr__,QTransform *this,bool *invertible)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  qreal qVar7;
  TransformationType TVar8;
  ushort uVar9;
  long lVar10;
  bool bVar11;
  qreal *pqVar12;
  qreal *pqVar13;
  long in_FS_OFFSET;
  ulong uVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  ushort local_40;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pqVar12 = (qreal *)&DAT_006a3170;
  pqVar13 = (qreal *)__return_storage_ptr__;
  for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
    *pqVar13 = *pqVar12;
    pqVar12 = pqVar12 + 1;
    pqVar13 = pqVar13 + 1;
  }
  pqVar12 = (qreal *)&DAT_006a31c0;
  pqVar13 = (qreal *)__return_storage_ptr__;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    *pqVar13 = *pqVar12;
    pqVar12 = pqVar12 + 1;
    pqVar13 = pqVar13 + 1;
  }
  *(undefined2 *)&__return_storage_ptr__->field_0x48 = 0xa800;
  if ((*(ushort *)&this->field_0x48 & 0x3e0) == 0) {
    TVar8 = *(ushort *)&this->field_0x48 & (TxProject|TxShear|TxRotate|TxScale|TxTranslate);
  }
  else {
    TVar8 = type(this);
  }
  bVar11 = true;
  uVar9 = 0xa800;
  if (TVar8 == TxNone) goto LAB_004361fa;
  if (TVar8 == TxScale) {
    dVar16 = this->m_matrix[0][0];
    uVar14 = -(ulong)(dVar16 < -dVar16);
    if ((1e-12 < (double)(~uVar14 & (ulong)dVar16 | (ulong)-dVar16 & uVar14)) &&
       (dVar1 = this->m_matrix[1][1], uVar14 = -(ulong)(dVar1 < -dVar1),
       1e-12 < (double)(~uVar14 & (ulong)dVar1 | (ulong)-dVar1 & uVar14))) {
      auVar15._8_8_ = dVar1;
      auVar15._0_8_ = dVar16;
      auVar15 = divpd(_DAT_00679110,auVar15);
      __return_storage_ptr__->m_matrix[0][0] = auVar15._0_8_;
      __return_storage_ptr__->m_matrix[1][1] = auVar15._8_8_;
      dVar16 = this->m_matrix[2][1];
      __return_storage_ptr__->m_matrix[2][0] = -this->m_matrix[2][0] * auVar15._0_8_;
      __return_storage_ptr__->m_matrix[2][1] = -dVar16 * auVar15._8_8_;
      goto LAB_004361fa;
    }
  }
  else {
    if (TVar8 == TxTranslate) {
      qVar7 = this->m_matrix[2][1];
      __return_storage_ptr__->m_matrix[2][0] = -this->m_matrix[2][0];
      __return_storage_ptr__->m_matrix[2][1] = -qVar7;
      goto LAB_004361fa;
    }
    dVar16 = this->m_matrix[2][2];
    dVar1 = this->m_matrix[2][1];
    dVar2 = this->m_matrix[1][2];
    dVar3 = this->m_matrix[0][1];
    dVar4 = this->m_matrix[0][2];
    dVar5 = this->m_matrix[1][1];
    dVar16 = (dVar2 * dVar3 - dVar4 * dVar5) * this->m_matrix[2][0] +
             ((dVar16 * dVar5 - dVar2 * dVar1) * this->m_matrix[0][0] -
             (dVar16 * dVar3 - dVar1 * dVar4) * this->m_matrix[1][0]);
    uVar14 = -(ulong)(dVar16 < -dVar16);
    if (1e-12 < (double)(~uVar14 & (ulong)dVar16 | (ulong)-dVar16 & uVar14)) {
      adjoint(this);
      if ((dVar16 != 0.0) || (NAN(dVar16))) {
        dVar16 = 1.0 / dVar16;
        if ((dVar16 != 1.0) || (NAN(dVar16))) {
          local_88 = local_88 * dVar16;
          dStack_80 = dStack_80 * dVar16;
          local_78 = local_78 * dVar16;
          dStack_70 = dStack_70 * dVar16;
          local_68 = local_68 * dVar16;
          dStack_60 = dStack_60 * dVar16;
          local_58 = dVar16 * local_58;
          dStack_50 = dVar16 * dStack_50;
          local_48 = local_48 * dVar16;
          if ((local_40 & 0x3c0) == 0) {
            local_40 = local_40 & 0xfc1f | 0x40;
          }
        }
      }
      __return_storage_ptr__->m_matrix[0][0] = local_88;
      __return_storage_ptr__->m_matrix[0][1] = dStack_80;
      __return_storage_ptr__->m_matrix[0][2] = local_78;
      __return_storage_ptr__->m_matrix[1][0] = dStack_70;
      __return_storage_ptr__->m_matrix[1][1] = local_68;
      __return_storage_ptr__->m_matrix[1][2] = dStack_60;
      __return_storage_ptr__->m_matrix[2][0] = local_58;
      __return_storage_ptr__->m_matrix[2][1] = dStack_50;
      __return_storage_ptr__->m_matrix[2][2] = local_48;
      *(ushort *)&__return_storage_ptr__->field_0x48 = local_40;
      uVar9 = local_40 & 0xfc00;
      goto LAB_004361fa;
    }
  }
  bVar11 = false;
LAB_004361fa:
  if (invertible != (bool *)0x0) {
    *invertible = bVar11;
  }
  if (bVar11 != false) {
    *(ushort *)&__return_storage_ptr__->field_0x48 = uVar9 | *(ushort *)&this->field_0x48 & 0x3ff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTransform QTransform::inverted(bool *invertible) const
{
    QTransform invert;
    bool inv = true;

    switch(inline_type()) {
    case TxNone:
        break;
    case TxTranslate:
        invert.m_matrix[2][0] = -m_matrix[2][0];
        invert.m_matrix[2][1] = -m_matrix[2][1];
        break;
    case TxScale:
        inv = !qFuzzyIsNull(m_matrix[0][0]);
        inv &= !qFuzzyIsNull(m_matrix[1][1]);
        if (inv) {
            invert.m_matrix[0][0] = 1. / m_matrix[0][0];
            invert.m_matrix[1][1] = 1. / m_matrix[1][1];
            invert.m_matrix[2][0] = -m_matrix[2][0] * invert.m_matrix[0][0];
            invert.m_matrix[2][1] = -m_matrix[2][1] * invert.m_matrix[1][1];
        }
        break;
    default:
        // general case
        qreal det = determinant();
        inv = !qFuzzyIsNull(det);
        if (inv)
            invert = adjoint() / det;
        break;
    }

    if (invertible)
        *invertible = inv;

    if (inv) {
        // inverting doesn't change the type
        invert.m_type = m_type;
        invert.m_dirty = m_dirty;
    }

    return invert;
}